

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O2

void ly_path_predicates_free(ly_ctx *ctx,ly_path_predicate *predicates)

{
  ulong *__ptr;
  undefined8 *puVar1;
  ulong uVar2;
  lysf_ctx local_48;
  
  local_48.ext_set.field_2.dnodes = (lyd_node **)0x0;
  local_48.mod = (lys_module *)0x0;
  local_48.ext_set.size = 0;
  local_48.ext_set.count = 0;
  if (predicates != (ly_path_predicate *)0x0) {
    __ptr = (ulong *)((long)&predicates[-1].field_1 + 0x28);
    puVar1 = (undefined8 *)((long)&predicates->field_1 + 8);
    local_48.ctx = ctx;
    for (uVar2 = 0; uVar2 < *__ptr; uVar2 = uVar2 + 1) {
      if (*(int *)(puVar1 + -2) - 1U < 2) {
        if (puVar1[1] != 0) {
          (**(code **)(*(long *)(puVar1[1] + 0x10) + 0x38))(ctx,puVar1);
          lysc_type_free(&local_48,(lysc_type *)puVar1[1]);
        }
      }
      else if (*(int *)(puVar1 + -2) == 3) {
        free((void *)*puVar1);
      }
      puVar1 = puVar1 + 7;
    }
    free(__ptr);
  }
  return;
}

Assistant:

void
ly_path_predicates_free(const struct ly_ctx *ctx, struct ly_path_predicate *predicates)
{
    LY_ARRAY_COUNT_TYPE u;
    struct lysf_ctx fctx = {.ctx = (struct ly_ctx *)ctx};

    if (!predicates) {
        return;
    }

    LY_ARRAY_FOR(predicates, u) {
        switch (predicates[u].type) {
        case LY_PATH_PREDTYPE_POSITION:
            /* nothing to free */
            break;
        case LY_PATH_PREDTYPE_LIST:
        case LY_PATH_PREDTYPE_LEAFLIST:
            if (predicates[u].value.realtype) {
                predicates[u].value.realtype->plugin->free(ctx, &predicates[u].value);
                lysc_type_free(&fctx, (struct lysc_type *)predicates[u].value.realtype);
            }
            break;
        case LY_PATH_PREDTYPE_LIST_VAR:
            free(predicates[u].variable);
            break;
        }
    }
    LY_ARRAY_FREE(predicates);
}